

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kprint.c
# Opt level: O1

void print_string(LispPTR x)

{
  ulong uVar1;
  uint uVar2;
  DLword *pDVar3;
  
  if ((x & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)x);
  }
  pDVar3 = Lisp_world;
  uVar1 = *(ulong *)(Lisp_world + x);
  putchar(0x22);
  uVar2 = (uint)(uVar1 >> 0x20) & 0xffff;
  if ((uVar1 & 0xffff00000000) != 0) {
    pDVar3 = pDVar3 + ((uint)uVar1 & 0xfffffff);
    do {
      putchar((uint)*(byte *)((ulong)pDVar3 ^ 3));
      pDVar3 = (DLword *)((long)pDVar3 + 1);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  putchar(0x22);
  return;
}

Assistant:

void print_string(LispPTR x) {
  struct stringp *string_point;
  DLword st_length;
  DLbyte *string_base;

  int i;

  string_point = (struct stringp *)NativeAligned4FromLAddr(x);
  st_length = string_point->length;
  string_base = (DLbyte *)NativeAligned2FromLAddr(string_point->base);

  printf("%c", DOUBLEQUOTE); /* print %" */

  for (i = 1; i <= st_length; i++) {
    printf("%c", GETBYTE(string_base));
    string_base++;
  }

  printf("%c", DOUBLEQUOTE); /* print %" */
}